

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>,_true>
           *this,List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
                 *list,int index)

{
  int iVar1;
  Type ppvVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  
  if ((index < 0) ||
     ((list->
      super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  iVar1 = (list->
          super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
          ).count;
  if (index + 1 < iVar1) {
    lVar6 = (long)(index + 1);
    do {
      ppvVar2 = (list->
                super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
                ).buffer;
      ppvVar2[index] = ppvVar2[lVar6];
      index = index + 1;
      lVar6 = lVar6 + 1;
    } while (iVar1 + -1 != index);
  }
  (list->
  super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
  ).count = iVar1 + -1;
  (list->
  super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
  ).buffer[iVar1 + -1] = (void *)0x0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }